

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O1

void HTS_Engine_save_generated_speech(HTS_Engine *engine,FILE *fp)

{
  undefined8 in_RAX;
  size_t sVar1;
  size_t sVar2;
  HTS_GStreamSet *gss;
  double dVar3;
  short temp;
  undefined8 uStack_28;
  
  gss = &engine->gss;
  uStack_28 = in_RAX;
  sVar1 = HTS_GStreamSet_get_total_nsamples(gss);
  if (sVar1 != 0) {
    sVar1 = 0;
    do {
      dVar3 = HTS_GStreamSet_get_speech(gss,sVar1);
      if (dVar3 <= 32767.0) {
        if (-32768.0 <= dVar3) {
          uStack_28 = CONCAT26((short)(int)dVar3,(undefined6)uStack_28);
        }
        else {
          uStack_28 = CONCAT26(0x8000,(undefined6)uStack_28);
        }
      }
      else {
        uStack_28 = CONCAT26(0x7fff,(undefined6)uStack_28);
      }
      fwrite((void *)((long)&uStack_28 + 6),2,1,(FILE *)fp);
      sVar1 = sVar1 + 1;
      sVar2 = HTS_GStreamSet_get_total_nsamples(gss);
    } while (sVar1 < sVar2);
  }
  return;
}

Assistant:

void HTS_Engine_save_generated_speech(HTS_Engine * engine, FILE * fp)
{
   size_t i;
   double x;
   short temp;
   HTS_GStreamSet *gss = &engine->gss;

   for (i = 0; i < HTS_GStreamSet_get_total_nsamples(gss); i++) {
      x = HTS_GStreamSet_get_speech(gss, i);
      if (x > 32767.0)
         temp = 32767;
      else if (x < -32768.0)
         temp = -32768;
      else
         temp = (short) x;
      fwrite(&temp, sizeof(short), 1, fp);
   }
}